

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_connect_convolution.c
# Opt level: O2

rt_function_error_t allocate_binary_connect_convolution_local_context(rt_function_t *f)

{
  rt_variable_t **pprVar1;
  rt_function_error_t rVar2;
  ulong uVar3;
  ulong uVar4;
  
  f->exec_func = exec_binary_connect_convolution;
  uVar4 = 0;
  uVar3 = (ulong)(uint)f->num_of_inputs;
  if (f->num_of_inputs < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) goto LAB_0011aef1;
    pprVar1 = f->inputs + uVar4;
    uVar4 = uVar4 + 1;
  } while (((*pprVar1)->field_0x10 & 0xf) == 0);
  f->exec_func = exec_convolution_generic;
LAB_0011aef1:
  if (((*f->outputs)->field_0x10 & 0xf) != 0) {
    f->exec_func = exec_convolution_generic;
  }
  rVar2 = allocate_convolution_local_context_common(f,0,2,3,-1,0);
  return rVar2;
}

Assistant:

rt_function_error_t
allocate_binary_connect_convolution_local_context(rt_function_t *f) {
  assert(sizeof(convolution_local_context_t) ==
         sizeof(binary_connect_convolution_local_context_t));

#ifdef CONFIG_BINARYCONNECTCONVOLUTION_FLOAT32
  f->exec_func = exec_binary_connect_convolution;
#endif /* CONFIG_BINARYCONNECTCONVOLUTION_FLOAT32 */

#ifdef CONFIG_BINARYCONNECTCONVOLUTION_GENERIC
  for (int i = 0; i < f->num_of_inputs; i++) {
    if (f->inputs[i]->type != NN_DATA_TYPE_FLOAT) {
      f->exec_func = exec_convolution_generic;
      break;
    }
  }
  if (f->outputs[0]->type != NN_DATA_TYPE_FLOAT) {
    f->exec_func = exec_convolution_generic;
  }
#endif /* CONFIG_BINARYCONNECTCONVOLUTION_GENERIC */
  return allocate_convolution_local_context_common(f, X, WEIGHT, BIAS, ALPHA,
                                                   Y0);
}